

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_rounding.cpp
# Opt level: O3

IncrementPrecision *
icu_63::number::Precision::constructIncrement
          (IncrementPrecision *__return_storage_ptr__,double increment,int32_t minFrac)

{
  bool sign;
  int32_t point;
  int32_t length;
  char buffer [18];
  bool local_49;
  double local_48;
  short local_40 [2];
  short local_3c [2];
  char local_38 [24];
  
  local_48 = increment;
  double_conversion::DoubleToStringConverter::DoubleToAscii
            (increment,SHORTEST,0,local_38,0x12,&local_49,(int *)local_3c,(int *)local_40);
  (__return_storage_ptr__->super_Precision).fType = RND_INCREMENT;
  (__return_storage_ptr__->super_Precision).fUnion.increment.fIncrement = local_48;
  (__return_storage_ptr__->super_Precision).fUnion.increment.fMinFrac = (digits_t)minFrac;
  (__return_storage_ptr__->super_Precision).fUnion.increment.fMaxFrac = local_3c[0] - local_40[0];
  (__return_storage_ptr__->super_Precision).fRoundingMode = UNUM_FOUND_HALFEVEN;
  return __return_storage_ptr__;
}

Assistant:

IncrementPrecision Precision::constructIncrement(double increment, int32_t minFrac) {
    IncrementSettings settings;
    settings.fIncrement = increment;
    settings.fMinFrac = static_cast<digits_t>(minFrac);
    // One of the few pre-computed quantities:
    // Note: it is possible for minFrac to be more than maxFrac... (misleading)
    settings.fMaxFrac = roundingutils::doubleFractionLength(increment);
    PrecisionUnion union_;
    union_.increment = settings;
    return {RND_INCREMENT, union_, kDefaultMode};
}